

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SslSocket.cpp
# Opt level: O1

bool __thiscall SslTcpServerImpl::SetDHParameter(SslTcpServerImpl *this,char *szDhParamFileName)

{
  pointer pSVar1;
  bool bVar2;
  wchar_t *local_40 [2];
  long local_30 [2];
  
  pSVar1 = (this->m_SslCtx).
           super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pSVar1 == (this->m_SslCtx).
                super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
                ._M_impl.super__Vector_impl_data._M_start) {
    bVar2 = false;
  }
  else {
    bVar2 = OpenSSLWrapper::SslServerContext::SetDhParamFile(pSVar1 + -1,szDhParamFileName);
    if (!bVar2) {
      local_40[0] = (wchar_t *)local_30;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                ((wstring *)local_40,L"DH File could not be loaded\r\n",L"");
      OutputDebugString(local_40[0]);
      if (local_40[0] != (wchar_t *)local_30) {
        operator_delete(local_40[0],local_30[0] * 4 + 4);
      }
      pSVar1 = (this->m_SslCtx).
               super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      (this->m_SslCtx).
      super__Vector_base<OpenSSLWrapper::SslServerContext,_std::allocator<OpenSSLWrapper::SslServerContext>_>
      ._M_impl.super__Vector_impl_data._M_finish = pSVar1 + -1;
      (**pSVar1[-1].super_SslContext._vptr_SslContext)();
    }
  }
  return bVar2;
}

Assistant:

bool SslTcpServerImpl::SetDHParameter(const char* const szDhParamFileName)
{
    if (m_SslCtx.size() == 0)
        return false;
    const bool bRet = m_SslCtx.back().SetDhParamFile(szDhParamFileName);
    if (bRet == false)
    {
        OutputDebugString(wstring(L"DH File could not be loaded\r\n").c_str());
        m_SslCtx.pop_back();
    }
    return bRet;
}